

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_subpixel_8t_intrin_ssse3.c
# Opt level: O0

void aom_filter_block1d8_h4_ssse3
               (uint8_t *src_ptr,ptrdiff_t src_pixels_per_line,uint8_t *output_ptr,
               ptrdiff_t output_pitch,uint32_t output_height,int16_t *filter)

{
  undefined1 auVar1 [16];
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 (*in_R9) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  __m128i filt2Reg;
  __m128i addFilterReg32;
  __m128i filtersReg;
  int local_31c;
  undefined8 local_2e8;
  undefined8 *local_260;
  undefined1 (*local_250) [16];
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  uint i;
  __m128i srcReg32b1;
  __m128i srcRegFilt32b3;
  __m128i srcRegFilt32b2;
  __m128i srcRegFilt32b1_1;
  __m128i thirdFilters;
  __m128i secondFilters;
  __m128i filt3Reg;
  
  local_250 = (undefined1 (*) [16])(in_RDI + -3);
  auVar2 = psraw(*in_R9,ZEXT416(1));
  auVar3 = packsswb(auVar2,auVar2);
  auVar4._8_8_ = 0x302030203020302;
  auVar4._0_8_ = 0x302030203020302;
  auVar4 = pshufb(auVar3,auVar4);
  auVar2._8_8_ = 0x504050405040504;
  auVar2._0_8_ = 0x504050405040504;
  auVar2 = pshufb(auVar3,auVar2);
  local_260 = in_RDX;
  for (local_31c = in_R8D; local_31c != 0; local_31c = local_31c + -1) {
    auVar5[8] = '\x06';
    auVar5[9] = '\a';
    auVar5[10] = '\a';
    auVar5[0xb] = '\b';
    auVar5[0xc] = '\b';
    auVar5[0xd] = '\t';
    auVar5[0xe] = '\t';
    auVar5[0xf] = '\n';
    auVar5[0] = '\x02';
    auVar5[1] = '\x03';
    auVar5[2] = '\x03';
    auVar5[3] = '\x04';
    auVar5[4] = '\x04';
    auVar5[5] = '\x05';
    auVar5[6] = '\x05';
    auVar5[7] = '\x06';
    auVar5 = pshufb(*local_250,auVar5);
    auVar3[8] = '\b';
    auVar3[9] = '\t';
    auVar3[10] = '\t';
    auVar3[0xb] = '\n';
    auVar3[0xc] = '\n';
    auVar3[0xd] = '\v';
    auVar3[0xe] = '\v';
    auVar3[0xf] = '\f';
    auVar3[0] = '\x04';
    auVar3[1] = '\x05';
    auVar3[2] = '\x05';
    auVar3[3] = '\x06';
    auVar3[4] = '\x06';
    auVar3[5] = '\a';
    auVar3[6] = '\a';
    auVar3[7] = '\b';
    auVar3 = pshufb(*local_250,auVar3);
    auVar5 = pmaddubsw(auVar5,auVar4);
    auVar3 = pmaddubsw(auVar3,auVar2);
    auVar3 = paddsw(auVar5,auVar3);
    auVar1._8_8_ = 0x20002000200020;
    auVar1._0_8_ = 0x20002000200020;
    auVar3 = paddsw(auVar3,auVar1);
    auVar3 = psraw(auVar3,ZEXT416(6));
    local_238 = auVar3._0_2_;
    sStack_236 = auVar3._2_2_;
    sStack_234 = auVar3._4_2_;
    sStack_232 = auVar3._6_2_;
    sStack_230 = auVar3._8_2_;
    sStack_22e = auVar3._10_2_;
    sStack_22c = auVar3._12_2_;
    sStack_22a = auVar3._14_2_;
    local_2e8 = CONCAT17((0 < sStack_22a) * (sStack_22a < 0x100) * auVar3[0xe] - (0xff < sStack_22a)
                         ,CONCAT16((0 < sStack_22c) * (sStack_22c < 0x100) * auVar3[0xc] -
                                   (0xff < sStack_22c),
                                   CONCAT15((0 < sStack_22e) * (sStack_22e < 0x100) * auVar3[10] -
                                            (0xff < sStack_22e),
                                            CONCAT14((0 < sStack_230) * (sStack_230 < 0x100) *
                                                     auVar3[8] - (0xff < sStack_230),
                                                     CONCAT13((0 < sStack_232) *
                                                              (sStack_232 < 0x100) * auVar3[6] -
                                                              (0xff < sStack_232),
                                                              CONCAT12((0 < sStack_234) *
                                                                       (sStack_234 < 0x100) *
                                                                       auVar3[4] -
                                                                       (0xff < sStack_234),
                                                                       CONCAT11((0 < sStack_236) *
                                                                                (sStack_236 < 0x100)
                                                                                * auVar3[2] -
                                                                                (0xff < sStack_236),
                                                                                (0 < local_238) *
                                                                                (local_238 < 0x100)
                                                                                * auVar3[0] -
                                                                                (0xff < local_238)))
                                                             )))));
    local_250 = (undefined1 (*) [16])(*local_250 + in_RSI);
    *local_260 = local_2e8;
    local_260 = (undefined8 *)(in_RCX + (long)local_260);
  }
  return;
}

Assistant:

static void aom_filter_block1d8_h4_ssse3(
    const uint8_t *src_ptr, ptrdiff_t src_pixels_per_line, uint8_t *output_ptr,
    ptrdiff_t output_pitch, uint32_t output_height, const int16_t *filter) {
  __m128i filtersReg;
  __m128i addFilterReg32, filt2Reg, filt3Reg;
  __m128i secondFilters, thirdFilters;
  __m128i srcRegFilt32b1_1, srcRegFilt32b2, srcRegFilt32b3;
  __m128i srcReg32b1;
  unsigned int i;
  src_ptr -= 3;
  addFilterReg32 = _mm_set1_epi16(32);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  filtersReg = _mm_srai_epi16(filtersReg, 1);
  // converting the 16 bit (short) to 8 bit (byte) and have the same data
  // in both lanes of 128 bit register.
  filtersReg = _mm_packs_epi16(filtersReg, filtersReg);

  // duplicate only the second 16 bits (third and forth byte)
  // across 256 bit register
  secondFilters = _mm_shuffle_epi8(filtersReg, _mm_set1_epi16(0x302u));
  // duplicate only the third 16 bits (fifth and sixth byte)
  // across 256 bit register
  thirdFilters = _mm_shuffle_epi8(filtersReg, _mm_set1_epi16(0x504u));

  filt2Reg = _mm_load_si128((__m128i const *)(filt_h4 + 32));
  filt3Reg = _mm_load_si128((__m128i const *)(filt_h4 + 32 * 2));

  for (i = output_height; i > 0; i -= 1) {
    srcReg32b1 = _mm_loadu_si128((const __m128i *)src_ptr);

    // filter the source buffer
    srcRegFilt32b3 = _mm_shuffle_epi8(srcReg32b1, filt2Reg);
    srcRegFilt32b2 = _mm_shuffle_epi8(srcReg32b1, filt3Reg);

    // multiply 2 adjacent elements with the filter and add the result
    srcRegFilt32b3 = _mm_maddubs_epi16(srcRegFilt32b3, secondFilters);
    srcRegFilt32b2 = _mm_maddubs_epi16(srcRegFilt32b2, thirdFilters);

    srcRegFilt32b1_1 = _mm_adds_epi16(srcRegFilt32b3, srcRegFilt32b2);

    // shift by 6 bit each 16 bit
    srcRegFilt32b1_1 = _mm_adds_epi16(srcRegFilt32b1_1, addFilterReg32);
    srcRegFilt32b1_1 = _mm_srai_epi16(srcRegFilt32b1_1, 6);

    // shrink to 8 bit each 16 bits
    srcRegFilt32b1_1 = _mm_packus_epi16(srcRegFilt32b1_1, _mm_setzero_si128());

    src_ptr += src_pixels_per_line;

    _mm_storel_epi64((__m128i *)output_ptr, srcRegFilt32b1_1);

    output_ptr += output_pitch;
  }
}